

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteBndRangeOrCompl
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this,File *nm,
          double L,double U,int k,int cvar)

{
  char *pcVar1;
  char *fmt;
  
  if (0 < k) {
    TextFormatter::apr(&this->super_FormatterType,nm,"5 %d %d\n",k,(ulong)(cvar + 1));
    return;
  }
  if (-1.79769313486232e+308 < L) {
    pcVar1 = "4 %.16g\n";
    if (L != U) {
      pcVar1 = "0 %.16g %.16g\n";
    }
    if (NAN(L) || NAN(U)) {
      pcVar1 = "0 %.16g %.16g\n";
    }
    fmt = "2 %.16g\n";
    if (U < 1.79769313486232e+308) {
      fmt = pcVar1;
    }
    TextFormatter::apr(&this->super_FormatterType,nm,fmt);
    return;
  }
  pcVar1 = "1 %.16g\n";
  if (1.79769313486232e+308 <= U) {
    pcVar1 = "3\n";
  }
  TextFormatter::apr(&this->super_FormatterType,nm,pcVar1,U);
  return;
}

Assistant:

void NLWriter2<Params>::WriteBndRangeOrCompl(
    File& nm,
    double L, double U, int k, int cvar) {
  if (k<=0) {          // normal algebraic constraint
    if (L <= NegInfty())
      apr(nm, U >= Infty()
          ? "3\n" : "1 %.16g\n", U);
    else
      apr(nm, U >= Infty() ? "2 %.16g\n"
                           : L == U ? "4 %.16g\n"
                                    : "0 %.16g %.16g\n",
          L, U);
  } else {             // complementarity
    apr(nm, "5 %d %d\n", k, cvar + 1);   // add +1 here
  }
}